

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageProcessing.cpp
# Opt level: O2

Mat * preprocessImage(Mat *img,int numRows,int numCols)

{
  long lVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  int in_ECX;
  int x;
  int iVar5;
  long lVar6;
  undefined4 in_register_00000034;
  long lVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  int local_3b4;
  double local_3b0;
  undefined8 local_398;
  undefined8 uStack_390;
  Mat region;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  countours;
  Mat newImg;
  int local_2f0;
  int local_2ec;
  Size local_2e8;
  long *local_2b0;
  Rect bnd;
  Mat temp;
  undefined8 local_1b8 [2];
  Mat realClone;
  undefined4 uStack_1a4;
  
  lVar7 = CONCAT44(in_register_00000034,numRows);
  cv::Mat::Mat(&temp);
  iVar4 = *(int *)(lVar7 + 8);
  uVar11 = (long)iVar4 / 2 & 0xffffffff;
  iVar5 = -(int)((long)iVar4 / 2);
  local_3b4 = -1;
  local_3b0._0_4_ = -1;
  local_398._0_4_ = -1;
  iVar3 = -1;
  do {
    iVar8 = (int)uVar11;
    if (iVar4 <= iVar8) {
      cv::Mat::Mat(&newImg);
      cv::Mat::zeros((int)&realClone,*(int *)(lVar7 + 8),*(int *)(lVar7 + 0xc));
      (**(code **)(*(long *)CONCAT44(uStack_1a4,_realClone) + 0x18))
                ((long *)CONCAT44(uStack_1a4,_realClone),&realClone,&newImg,0xffffffffffffffff);
      cv::MatExpr::~MatExpr((MatExpr *)&realClone);
      iVar4 = (local_3b4 - local_3b0._0_4_) / 2;
      iVar5 = ((int)local_398 - iVar3) / 2;
      iVar8 = local_2f0 / 2 - iVar5;
      for (lVar9 = (long)iVar8; lVar9 < local_2f0 / 2 + iVar5; lVar9 = lVar9 + 1) {
        lVar1 = *local_2b0;
        iVar10 = local_3b0._0_4_;
        for (lVar6 = (long)(local_2ec / 2 - iVar4); lVar6 < local_2ec / 2 + iVar4; lVar6 = lVar6 + 1
            ) {
          *(undefined1 *)(lVar1 * lVar9 + (long)local_2e8 + lVar6) =
               *(undefined1 *)
                ((long)iVar10 +
                **(long **)(lVar7 + 0x48) * (long)((iVar3 - iVar8) + (int)lVar9) +
                *(long *)(lVar7 + 0x10));
          iVar10 = iVar10 + 1;
        }
      }
      cv::Mat::Mat(img,numCols,in_ECX,0);
      _realClone = 0x1010000;
      _region = 0x2010000;
      cv::resize(0,0);
      cv::Mat::clone();
      bnd._8_8_ = &countours;
      local_398 = 0;
      uStack_390._0_4_ = 0;
      uStack_390._4_4_ = 0;
      countours.
      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      countours.
      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      countours.
      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      _region = 0x1010000;
      bnd.x = -0x7dfbfff4;
      cv::findContours(&region,&bnd,1,2);
      uVar12 = 0;
      local_3b0 = 0.0;
      while( true ) {
        if ((ulong)(((long)countours.
                           super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)countours.
                          super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= (ulong)uVar12)
        break;
        _region = 0x8103000c;
        cv::boundingRect((_InputArray *)&bnd);
        iVar4 = bnd.width * bnd.height;
        if (local_3b0 < (double)iVar4) {
          local_398 = CONCAT44(bnd.y,bnd.x);
          uStack_390._0_4_ = bnd.width;
          uStack_390._4_4_ = bnd.height;
          local_3b0 = (double)iVar4;
        }
        uVar12 = uVar12 + 1;
      }
      local_1b8[0] = local_398;
      local_1b8[1]._0_4_ = (int)uStack_390;
      local_1b8[1]._4_4_ = uStack_390._4_4_;
      cv::Mat::Mat(&region,&realClone,(Rect_ *)local_1b8);
      cVar2 = cv::Mat::empty();
      if (cVar2 == '\0') {
        bnd.x = 0x1010000;
        bnd._8_8_ = &region;
        cv::resize(0,0);
      }
      bnd.x = 0x2010000;
      bnd._8_8_ = img;
      cv::Mat::convertTo((_OutputArray *)img,(int)&bnd,0.00392156862745098,0.0);
      cv::Mat::reshape((int)&bnd,(int)img);
      cv::Mat::operator=(img,(Mat *)&bnd);
      cv::Mat::~Mat((Mat *)&bnd);
      cv::Mat::~Mat(&region);
      std::
      vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ::~vector(&countours);
      cv::Mat::~Mat(&realClone);
      cv::Mat::~Mat(&newImg);
      cv::Mat::~Mat(&temp);
      return img;
    }
    if ((int)local_398 == -1) {
      cv::Mat::row(&realClone,numRows);
      cv::Mat::operator=(&temp,&realClone);
      cv::Mat::~Mat(&realClone);
      cv::Mat::Mat(&realClone,&temp);
      _region = 0x1010000;
      cv::sum((_InputArray *)&newImg);
      if (_newImg < 50.0) {
LAB_0010b9b7:
        local_398._0_4_ = iVar8;
      }
      else {
        local_398._0_4_ = -1;
        if (iVar8 == *(int *)(lVar7 + 8) + -1) goto LAB_0010b9b7;
      }
      cv::Mat::~Mat(&realClone);
    }
    if (iVar3 == -1) {
      cv::Mat::row(&realClone,numRows);
      cv::Mat::operator=(&temp,&realClone);
      cv::Mat::~Mat(&realClone);
      cv::Mat::Mat(&realClone,&temp);
      _region = 0x1010000;
      cv::sum((_InputArray *)&newImg);
      if (50.0 <= _newImg) {
        iVar4 = *(int *)(lVar7 + 8);
        iVar3 = -1;
        if (iVar8 == iVar4 + -1) goto LAB_0010ba58;
      }
      else {
        iVar4 = *(int *)(lVar7 + 8);
LAB_0010ba58:
        iVar3 = iVar4 + iVar5;
      }
      cv::Mat::~Mat(&realClone);
    }
    if (local_3b4 == -1) {
      cv::Mat::col(&realClone,numRows);
      cv::Mat::operator=(&temp,&realClone);
      cv::Mat::~Mat(&realClone);
      cv::Mat::Mat(&realClone,&temp);
      _region = 0x1010000;
      cv::sum((_InputArray *)&newImg);
      if (_newImg < 50.0) {
LAB_0010baf0:
        local_3b4 = iVar8;
      }
      else {
        local_3b4 = -1;
        if (iVar8 == *(int *)(lVar7 + 0xc) + -1) goto LAB_0010baf0;
      }
      cv::Mat::~Mat(&realClone);
    }
    if (local_3b0._0_4_ == -1) {
      cv::Mat::col(&realClone,numRows);
      cv::Mat::operator=(&temp,&realClone);
      cv::Mat::~Mat(&realClone);
      cv::Mat::Mat(&realClone,&temp);
      _region = 0x1010000;
      cv::sum((_InputArray *)&newImg);
      if (50.0 <= _newImg) {
        iVar4 = *(int *)(lVar7 + 0xc);
        local_3b0._0_4_ = -1;
        if (iVar8 == iVar4 + -1) goto LAB_0010bb90;
      }
      else {
        iVar4 = *(int *)(lVar7 + 0xc);
LAB_0010bb90:
        local_3b0._0_4_ = iVar4 + iVar5;
      }
      cv::Mat::~Mat(&realClone);
    }
    uVar11 = (ulong)(iVar8 + 1);
    iVar4 = *(int *)(lVar7 + 8);
    iVar5 = iVar5 + -1;
  } while( true );
}

Assistant:

Mat preprocessImage(Mat img, int numRows, int numCols)
{

    
    int rowTop=-1, rowBottom=-1, colLeft=-1, colRight=-1;

    Mat temp;
    int thresholdBottom = 50;
    int thresholdTop = 50;
    int thresholdLeft = 50;
    int thresholdRight = 50;
    int center = img.rows/2;
    for(int i=center;i<img.rows;i++){
        if(rowBottom==-1)
        {
            temp = img.row(i);
            Mat stub = temp;
            if(sum(stub).val[0] < thresholdBottom || i==img.rows-1)
                rowBottom = i;

        }

        if(rowTop==-1)
        {
            temp = img.row(img.rows-i);
            Mat stub = temp;
            if(sum(stub).val[0] < thresholdTop || i==img.rows-1)
                rowTop = img.rows-i;

        }
        if(colRight==-1)
        {
            temp = img.col(i);
            Mat stub = temp;
            if(sum(stub).val[0] < thresholdRight|| i==img.cols-1)
                colRight = i;

        }

        if(colLeft==-1)
        {
            temp = img.col(img.cols-i);
            Mat stub = temp;
            if(sum(stub).val[0] < thresholdLeft|| i==img.cols-1)
                colLeft = img.cols-i;
        }
    }
    Mat newImg;
    //newImg = img.clone();

    newImg = newImg.zeros(img.rows, img.cols, CV_8UC1);

    int startAtX = (newImg.cols/2)-(colRight-colLeft)/2;

    int startAtY = (newImg.rows/2)-(rowBottom-rowTop)/2;

    for(int y=startAtY;y<(newImg.rows/2)+(rowBottom-rowTop)/2;y++)
    {
        uchar *ptr = newImg.ptr<uchar>(y);
        for(int x=startAtX;x<(newImg.cols/2)+(colRight-colLeft)/2;x++)
        {
            ptr[x] = img.at<uchar>(rowTop+(y-startAtY),colLeft+(x-startAtX));
        }
    }
    Mat cloneImg = Mat(numRows, numCols, CV_8UC1);
    resize(newImg, cloneImg, Size(numRows, numCols), 0, 0 , INTER_NEAREST);
    // Now fill along the borders
    /*for(int i=0;i<cloneImg.rows;i++)
    {
        floodFill(cloneImg, Point(0, i), Scalar(0,0,0));

        floodFill(cloneImg, Point(cloneImg.cols-1, i), Scalar(0,0,0));

        floodFill(cloneImg, Point(i, 0), Scalar(0));
        floodFill(cloneImg, Point(i, cloneImg.rows-1), Scalar(0));
    }*/
    Mat realClone = cloneImg.clone();
    vector<vector<Point>> countours;
    findContours(cloneImg, countours, RETR_LIST, CHAIN_APPROX_SIMPLE);
    Rect prevb; double areaprev = 0; double area; 
    for(unsigned int i = 0; i<countours.size();i++){
        Rect bnd = boundingRect(countours[i]);
        area = bnd.height*bnd.width;
        if(area > areaprev){
            prevb = bnd;
            areaprev = area;
        }
    }
    Rect rec = prevb;
    Mat region = realClone(rec);
    if(!region.empty())
        resize(region, cloneImg, Size(numRows, numCols), 0, 0, INTER_NEAREST);   

    cloneImg.convertTo(cloneImg, CV_32FC1, 1.0/255.0 );
    //imshow("clone img", cloneImg);
    //waitKey(0);
    cloneImg = cloneImg.reshape(1,1);
    return cloneImg;
}